

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_stats.hpp
# Opt level: O1

bool __thiscall
duckdb::StringStatisticsState::TryTruncateMax
          (StringStatisticsState *this,string_t str,idx_t max_size,string *result,data_t max_byte)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  undefined8 local_50;
  long local_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  local_48 = str.value._8_8_;
  local_50 = str.value._0_8_;
  bVar4 = str.value._0_4_ < 0xd;
  lVar3 = local_48;
  if (bVar4) {
    lVar3 = (long)&local_50 + 4;
  }
  lVar2 = (long)&local_50 + 3;
  if (!bVar4) {
    lVar2 = local_48 + -1;
  }
  if (max_size != 0) {
    do {
      if (*(byte *)(lVar2 + max_size) < max_byte) goto LAB_01d0c943;
      max_size = max_size - 1;
    } while (max_size != 0);
    max_size = 0;
  }
LAB_01d0c943:
  if (max_size != 0) {
    local_40[0] = local_30;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,lVar3,lVar3 + max_size);
    ::std::__cxx11::string::operator=((string *)result,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
    pcVar1 = (result->_M_dataplus)._M_p + (max_size - 1);
    *pcVar1 = *pcVar1 + '\x01';
  }
  return max_size != 0;
}

Assistant:

bool TryTruncateMax(string_t str, idx_t max_size, string &result, data_t max_byte) {
		auto data = const_data_ptr_cast(str.GetData());

		// find the last position in the string which we can increment for the truncation
		// if ALL characters are above the max byte we cannot truncate
		idx_t increment_pos;
		for (increment_pos = max_size; increment_pos > 0; increment_pos--) {
			idx_t str_idx = increment_pos - 1;
			if (data[str_idx] < max_byte) {
				// found the increment position
				break;
			}
		}
		if (increment_pos == 0) {
			// all characters are above the max byte - we cannot truncate - return false
			return false;
		}
		// set up the result string - we don't care about anything after the increment pos
		result = string(str.GetData(), increment_pos);
		// actually increment
		result[increment_pos - 1]++;
		return true;
	}